

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestTest.cpp
# Opt level: O2

void __thiscall
TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningZero_Test::
~TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningZero_Test
          (TEST_UtestShellPointerArrayTest_ShuffleListTestWithRandomAlwaysReturningZero_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(UtestShellPointerArrayTest, ShuffleListTestWithRandomAlwaysReturningZero)
{
    UT_PTR_SET(PlatformSpecificRand, getZero);

    UtestShellPointerArray tests(test0);
    tests.shuffle(3);
    CHECK(tests.get(0) == test1);
    CHECK(tests.get(1) == test2);
    CHECK(tests.get(2) == test0);
}